

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstants.cpp
# Opt level: O0

void __thiscall
Vector6<double>::Vector6
          (Vector6<double> *this,RealType v0,RealType v1,RealType v2,RealType v3,RealType v4,
          RealType v5)

{
  Vector<double,_6U> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  
  OpenMD::Vector<double,_6U>::Vector(in_RDI);
  in_RDI->data_[0] = in_XMM0_Qa;
  in_RDI->data_[1] = in_XMM1_Qa;
  in_RDI->data_[2] = in_XMM2_Qa;
  in_RDI->data_[3] = in_XMM3_Qa;
  in_RDI->data_[4] = in_XMM4_Qa;
  in_RDI->data_[5] = in_XMM5_Qa;
  return;
}

Assistant:

inline Vector6(RealType v0, RealType v1, RealType v2, RealType v3,
                 RealType v4, RealType v5) {
    this->data_[0] = v0;
    this->data_[1] = v1;
    this->data_[2] = v2;
    this->data_[3] = v3;
    this->data_[4] = v4;
    this->data_[5] = v5;
  }